

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLDriver.cpp
# Opt level: O2

ITexture * __thiscall
irr::video::COpenGLDriver::createDeviceDependentTexture
          (COpenGLDriver *this,path *name,IImage *image)

{
  COpenGLCoreTexture<irr::video::COpenGLDriver> *this_00;
  IImage *image_local;
  array<irr::video::IImage_*> imageArray;
  
  image_local = image;
  core::array<irr::video::IImage_*>::array(&imageArray,1);
  core::array<irr::video::IImage_*>::push_back(&imageArray,&image_local);
  this_00 = (COpenGLCoreTexture<irr::video::COpenGLDriver> *)operator_new(0x108);
  COpenGLCoreTexture<irr::video::COpenGLDriver>::COpenGLCoreTexture
            (this_00,name,&imageArray,ETT_2D,this);
  std::_Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>::~_Vector_base
            ((_Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_> *)
             &imageArray);
  return &this_00->super_ITexture;
}

Assistant:

ITexture *COpenGLDriver::createDeviceDependentTexture(const io::path &name, IImage *image)
{
	core::array<IImage *> imageArray(1);
	imageArray.push_back(image);

	COpenGLTexture *texture = new COpenGLTexture(name, imageArray, ETT_2D, this);

	return texture;
}